

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O1

int dsa_pubkey_bits(ssh_keyalg *self,ptrlen pub)

{
  int iVar1;
  ssh_key *key;
  size_t sVar2;
  
  key = dsa_new_pub(self,pub);
  if (key == (ssh_key *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar2 = mp_get_nbits((mp_int *)key[-5].vt);
    iVar1 = (int)sVar2;
    dsa_freekey(key);
  }
  return iVar1;
}

Assistant:

static int dsa_pubkey_bits(const ssh_keyalg *self, ptrlen pub)
{
    ssh_key *sshk;
    struct dsa_key *dsa;
    int ret;

    sshk = dsa_new_pub(self, pub);
    if (!sshk)
        return -1;

    dsa = container_of(sshk, struct dsa_key, sshk);
    ret = mp_get_nbits(dsa->p);
    dsa_freekey(&dsa->sshk);

    return ret;
}